

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

bool __thiscall duckdb::AsOfProbeBuffer::NextLeft(AsOfProbeBuffer *this)

{
  ulong uVar1;
  bool bVar2;
  pointer pSVar3;
  pointer pPVar4;
  pointer pRVar5;
  ulong uVar6;
  data_ptr_t pdVar7;
  type sd;
  SBScanState *this_00;
  
  bVar2 = HasMoreData(this);
  if (bVar2) {
    DataChunk::Reset(&this->lhs_payload);
    pSVar3 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator->(&this->left_itr);
    pPVar4 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->(&this->lhs_scanner);
    pRVar5 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
             ::operator->(&pPVar4->scanner);
    uVar1 = pRVar5->total_scanned;
    uVar6 = uVar1 / pSVar3->block_capacity;
    if (uVar6 != (pSVar3->scan).block_idx) {
      this_00 = &pSVar3->scan;
      SBScanState::SetIndices(this_00,uVar6,0);
      if (uVar6 < pSVar3->block_count) {
        SBScanState::PinRadix(this_00,(pSVar3->scan).block_idx);
        pdVar7 = SBScanState::RadixPtr(this_00);
        pSVar3->block_ptr = pdVar7;
        if (pSVar3->all_constant == false) {
          sd = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator*(&((pSVar3->scan).sb)->blob_sorting_data);
          SBScanState::PinData(this_00,sd);
        }
      }
    }
    uVar6 = uVar1 % pSVar3->block_capacity;
    (pSVar3->scan).entry_idx = uVar6;
    pSVar3->entry_ptr = pSVar3->block_ptr + uVar6 * pSVar3->entry_size;
    pSVar3->entry_idx = uVar1;
    pPVar4 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->(&this->lhs_scanner);
    PayloadScanner::Scan(pPVar4,&this->lhs_payload);
  }
  return bVar2;
}

Assistant:

bool AsOfProbeBuffer::NextLeft() {
	if (!HasMoreData()) {
		return false;
	}

	//	Scan the next sorted chunk
	lhs_payload.Reset();
	left_itr->SetIndex(lhs_scanner->Scanned());
	lhs_scanner->Scan(lhs_payload);

	return true;
}